

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# on_off_sketch.h
# Opt level: O3

void __thiscall OO_FPI<8U>::~OO_FPI(OO_FPI<8U> *this)

{
  BitSet *pBVar1;
  
  (this->super_Abstract<8U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111d30;
  if (this->buckets != (Bucket *)0x0) {
    operator_delete__(this->buckets);
  }
  if (this->sketch != (int *)0x0) {
    operator_delete__(this->sketch);
  }
  pBVar1 = this->bucketBitsets;
  if ((pBVar1 != (BitSet *)0x0) && (pBVar1->bitset != (uchar *)0x0)) {
    operator_delete__(pBVar1->bitset);
  }
  operator_delete(pBVar1,0x10);
  pBVar1 = this->sketchBitsets;
  if ((pBVar1 != (BitSet *)0x0) && (pBVar1->bitset != (uchar *)0x0)) {
    operator_delete__(pBVar1->bitset);
  }
  operator_delete(pBVar1,0x10);
  Abstract<8U>::~Abstract(&this->super_Abstract<8U>);
  return;
}

Assistant:

~OO_FPI() {
		delete[] buckets;
		delete[] sketch;
		delete bucketBitsets;
		delete sketchBitsets;
	}